

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O2

float duckdb::VectorDecimalCastOperator<duckdb::TryCastFromDecimal>::Operation<int,float>
                (int input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  float result_value;
  allocator local_49;
  float local_48;
  float local_44;
  string local_40;
  
  bVar1 = TryCastFromDecimal::Operation<int,float>
                    (input,&local_44,*(CastParameters **)((long)dataptr + 8),
                     *(uint8_t *)((long)dataptr + 0x18),*(uint8_t *)((long)dataptr + 0x19));
  local_48 = local_44;
  if (!bVar1) {
    ::std::__cxx11::string::string((string *)&local_40,"Failed to cast decimal value",&local_49);
    local_48 = HandleVectorCastError::Operation<float>
                         (&local_40,mask,idx,(VectorTryCastData *)dataptr);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return local_48;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}